

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEndCapStyle ON_SubDEndCapStyleFromUnsigned(uint subd_cap_style_as_unsigned)

{
  if (subd_cap_style_as_unsigned < 5) {
    return (ON_SubDEndCapStyle)subd_cap_style_as_unsigned;
  }
  ON_SubDIncrementErrorCount();
  return Unset;
}

Assistant:

ON_SubDEndCapStyle ON_SubDEndCapStyleFromUnsigned(
  unsigned int subd_cap_style_as_unsigned
)
{
  switch (subd_cap_style_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Unset);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::None);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Triangles);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Quads);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDEndCapStyle::Ngon);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDEndCapStyle::Unset);
}